

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.c
# Opt level: O1

int dictionary_set(dictionary *d,char *key,char *val)

{
  char **__src;
  size_t __nmemb;
  uint uVar1;
  int iVar2;
  char **ppcVar3;
  char **__ptr;
  uint *__ptr_00;
  char *pcVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  iVar5 = -1;
  if (key != (char *)0x0 && d != (dictionary *)0x0) {
    uVar1 = dictionary_hash(key);
    iVar5 = d->n;
    if ((0 < (long)iVar5) && (lVar7 = d->size, 0 < lVar7)) {
      ppcVar3 = d->key;
      lVar6 = 0;
      do {
        if (((ppcVar3[lVar6] != (char *)0x0) && (uVar1 == d->hash[lVar6])) &&
           (iVar2 = strcmp(key,ppcVar3[lVar6]), iVar2 == 0)) {
          if (d->val[lVar6] != (char *)0x0) {
            free(d->val[lVar6]);
          }
          if (val == (char *)0x0) {
            pcVar4 = (char *)0x0;
          }
          else {
            pcVar4 = xstrdup(val);
          }
          d->val[lVar6] = pcVar4;
          return 0;
        }
        lVar6 = lVar6 + 1;
      } while (lVar7 != lVar6);
    }
    lVar7 = d->size;
    if (lVar7 == iVar5) {
      __nmemb = lVar7 * 2;
      ppcVar3 = (char **)calloc(__nmemb,8);
      __ptr = (char **)calloc(__nmemb,8);
      __ptr_00 = (uint *)calloc(__nmemb,4);
      if (__ptr_00 == (uint *)0x0 || (__ptr == (char **)0x0 || ppcVar3 == (char **)0x0)) {
        if (ppcVar3 != (char **)0x0) {
          free(ppcVar3);
        }
        if (__ptr != (char **)0x0) {
          free(__ptr);
        }
        if (__ptr_00 != (uint *)0x0) {
          free(__ptr_00);
        }
      }
      else {
        __src = d->val;
        memcpy(ppcVar3,__src,lVar7 * 8);
        memcpy(__ptr,d->key,lVar7 * 8);
        memcpy(__ptr_00,d->hash,lVar7 << 2);
        free(__src);
        free(d->key);
        free(d->hash);
        d->size = d->size << 1;
        d->val = ppcVar3;
        d->key = __ptr;
        d->hash = __ptr_00;
      }
      if (__ptr_00 == (uint *)0x0 || (__ptr == (char **)0x0 || ppcVar3 == (char **)0x0)) {
        return -1;
      }
    }
    lVar7 = (long)d->n;
    if (d->key[lVar7] != (char *)0x0) {
      do {
        lVar7 = lVar7 + 1;
        if (lVar7 == d->size) {
          lVar7 = 0;
        }
      } while (d->key[lVar7] != (char *)0x0);
    }
    pcVar4 = xstrdup(key);
    d->key[lVar7] = pcVar4;
    iVar5 = 0;
    if (val == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = xstrdup(val);
    }
    d->val[lVar7] = pcVar4;
    d->hash[lVar7] = uVar1;
    d->n = d->n + 1;
  }
  return iVar5;
}

Assistant:

int dictionary_set(dictionary * d, const char * key, const char * val)
{
    ssize_t         i ;
    unsigned       hash ;

    if (d == NULL || key == NULL) return -1 ;

    /* Compute hash for this key */
    hash = dictionary_hash(key) ;
    /* Find if value is already in dictionary */
    if (d->n > 0) {
        for (i = 0 ; i < d->size ; i++) {
            if (d->key[i] == NULL)
                continue ;
            if (hash == d->hash[i]) { /* Same hash value */
                if (!strcmp(key, d->key[i])) {   /* Same key */
                    /* Found a value: modify and return */
                    if (d->val[i] != NULL)
                        free(d->val[i]);
                    d->val[i] = (val ? xstrdup(val) : NULL);
                    /* Value has been modified: return */
                    return 0 ;
                }
            }
        }
    }
    /* Add a new value */
    /* See if dictionary needs to grow */
    if (d->n == d->size) {
        /* Reached maximum size: reallocate dictionary */
        if (dictionary_grow(d) != 0)
            return -1;
    }

    /* Insert key in the first empty slot. Start at d->n and wrap at
       d->size. Because d->n < d->size this will necessarily
       terminate. */
    for (i = d->n ; d->key[i] ; ) {
        if (++i == d->size) i = 0;
    }
    /* Copy key */
    d->key[i]  = xstrdup(key);
    d->val[i]  = (val ? xstrdup(val) : NULL) ;
    d->hash[i] = hash;
    d->n ++ ;
    return 0 ;
}